

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeWidgetItem::QTreeWidgetItem
          (QTreeWidgetItem *this,QTreeWidgetItem *parent,QStringList *strings,int type)

{
  long lVar1;
  QFlagsStorageHelper<Qt::ItemFlag,_4> QVar2;
  QString *atext;
  QTreeWidgetItem *this_00;
  qsizetype qVar3;
  undefined4 in_ECX;
  QList<QString> *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int i;
  undefined4 in_stack_ffffffffffffffa8;
  ItemFlag in_stack_ffffffffffffffac;
  ItemFlag IVar4;
  QTreeWidgetItemPrivate *in_stack_ffffffffffffffb0;
  ItemFlag IVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__QTreeWidgetItem_00d31678;
  *(undefined4 *)(in_RDI + 1) = in_ECX;
  QList<QList<QWidgetItemData>_>::QList((QList<QList<QWidgetItemData>_> *)0x9137c1);
  in_RDI[5] = 0;
  atext = (QString *)operator_new(0x30);
  QTreeWidgetItemPrivate::QTreeWidgetItemPrivate
            (in_stack_ffffffffffffffb0,
             (QTreeWidgetItem *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  in_RDI[6] = atext;
  in_RDI[7] = 0;
  QList<QTreeWidgetItem_*>::QList((QList<QTreeWidgetItem_*> *)0x913809);
  Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                (enum_type)in_stack_ffffffffffffffb0);
  QFlags<Qt::ItemFlag>::operator|
            ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  QFlags<Qt::ItemFlag>::operator|
            ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  QVar2.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator|
                 ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  ((QFlagsStorageHelper<Qt::ItemFlag,_4> *)(in_RDI + 0xb))->super_QFlagsStorage<Qt::ItemFlag> =
       QVar2.super_QFlagsStorage<Qt::ItemFlag>.i;
  IVar4 = NoItemFlags;
  while( true ) {
    this_00 = (QTreeWidgetItem *)(long)(int)IVar4;
    qVar3 = QList<QString>::size(in_RDX);
    if (qVar3 <= (long)this_00) break;
    IVar5 = IVar4;
    QList<QString>::at((QList<QString> *)this_00,CONCAT44(IVar4,in_stack_ffffffffffffffa8));
    setText((QTreeWidgetItem *)CONCAT44(in_ECX,IVar5),(int)((ulong)in_RDI >> 0x20),atext);
    in_stack_ffffffffffffffac = IVar4;
    IVar4 = IVar5 + ItemIsSelectable;
  }
  if (in_RSI != 0) {
    addChild(this_00,(QTreeWidgetItem *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(QTreeWidgetItem *parent, const QStringList &strings, int type)
    : rtti(type), d(new QTreeWidgetItemPrivate(this))
{
    for (int i = 0; i < strings.size(); ++i)
        setText(i, strings.at(i));
    if (parent)
        parent->addChild(this);
}